

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprinttobin.cpp
# Opt level: O0

void __thiscall FootprintToBin::WriteIdxFootprintFile(FootprintToBin *this)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  long local_48;
  longlong originalSize;
  unsigned_long zippedEventRowsLength;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> zer;
  FootprintToBin *this_local;
  
  (this->idx_).event_id = (this->super_ValidateFootprint).prevEventID_;
  (this->idx_).size = (long)this->rowCount_ * 0xc;
  zer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if ((this->zip_ & 1U) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
    sVar1 = std::vector<EventRow,_std::allocator<EventRow>_>::size(&this->eventRows_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,sVar1 * 0xc + 0x400
              );
    originalSize = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0);
    pvVar3 = std::vector<EventRow,_std::allocator<EventRow>_>::operator[](&this->eventRows_,0);
    sVar1 = std::vector<EventRow,_std::allocator<EventRow>_>::size(&this->eventRows_);
    compress(pvVar2,&originalSize,pvVar3,sVar1 * 0xc);
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0);
    fwrite(pvVar2,originalSize,1,(FILE *)this->fileOutBin_);
    (this->idx_).size = originalSize;
    std::vector<EventRow,_std::allocator<EventRow>_>::clear(&this->eventRows_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  }
  fwrite(&this->idx_,0x14,1,(FILE *)this->fileOutIdx_);
  if ((this->uncompressedSize_ & 1U) != 0) {
    local_48 = (long)this->rowCount_ * 0xc;
    fwrite(&local_48,8,1,(FILE *)this->fileOutIdx_);
  }
  (this->idx_).offset = (this->idx_).size + (this->idx_).offset;
  this->rowCount_ = 0;
  return;
}

Assistant:

void FootprintToBin::WriteIdxFootprintFile() {

  idx_.event_id = prevEventID_;
  idx_.size = rowCount_ * sizeof(EventRow);

  // Write zipped output to binary file
  if (zip_) {

    std::vector<unsigned char> zer;
    zer.resize(eventRows_.size() * sizeof(EventRow) + 1024);
    unsigned long zippedEventRowsLength = zer.size();
    compress(&zer[0], &zippedEventRowsLength, (unsigned char*)&eventRows_[0],
	     eventRows_.size() * sizeof(EventRow));
    fwrite((unsigned char*)&zer[0], zippedEventRowsLength, 1, fileOutBin_);

    // Overwrite with actual size of compressed buffer
    idx_.size = zippedEventRowsLength;

    eventRows_.clear();   // Reset

  }

  fwrite(&idx_, sizeof(idx_), 1, fileOutIdx_);

  // Write uncompressed size to index file if requested (only relevant for
  // zipped footprint files)
  if (uncompressedSize_) {
    long long originalSize = rowCount_ * sizeof(EventRow);
    fwrite(&originalSize, sizeof(originalSize), 1, fileOutIdx_);
  }

  // Set new offset and reset row counter
  idx_.offset += idx_.size;
  rowCount_ = 0;

}